

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O0

SUNErrCode
SUNLinSolSetPreconditioner_SPTFQMR
          (SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  SUNPSolveFn Psolve_local;
  SUNPSetupFn Psetup_local;
  void *PData_local;
  SUNLinearSolver S_local;
  
  *(SUNPSetupFn *)((long)S->content + 0x30) = Psetup;
  *(SUNPSolveFn *)((long)S->content + 0x38) = Psolve;
  *(void **)((long)S->content + 0x40) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_SPTFQMR(SUNLinearSolver S, void* PData,
                                              SUNPSetupFn Psetup,
                                              SUNPSolveFn Psolve)
{
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  SPTFQMR_CONTENT(S)->Psetup = Psetup;
  SPTFQMR_CONTENT(S)->Psolve = Psolve;
  SPTFQMR_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}